

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O1

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  fpclass_type fVar1;
  uint uVar2;
  SPxOut *pSVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  char cVar4;
  int iVar5;
  int iVar6;
  fpclass_type *pfVar7;
  bool *pbVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  char *pcVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  cpp_dec_float<200u,int,void> *pcVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined4 *puVar19;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *pvVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  Item *this_02;
  undefined4 *puVar22;
  bool bVar23;
  byte bVar24;
  Real a;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  Verbosity old_verbosity_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  uint local_fb4;
  undefined1 local_fa8 [16];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f98;
  undefined1 local_f90 [16];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f80;
  cpp_dec_float<200U,_int,_void> *local_f78;
  Item *local_f70;
  undefined1 local_f68 [32];
  undefined1 local_f48 [16];
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined1 local_f18 [16];
  undefined1 local_f08 [13];
  undefined3 uStack_efb;
  fpclass_type fStack_ef8;
  bool bStack_ef4;
  ulong local_ef0;
  uint *local_ee0;
  uint *local_ed8;
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ed0;
  undefined1 local_ec8 [32];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [16];
  undefined1 local_e88 [16];
  undefined1 local_e78 [16];
  undefined1 local_e68 [13];
  undefined3 uStack_e5b;
  fpclass_type fStack_e58;
  bool abStack_e54 [4];
  ulong local_e50;
  undefined1 local_e48 [32];
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [13];
  undefined3 uStack_ddb;
  fpclass_type fStack_dd8;
  bool abStack_dd4 [4];
  ulong local_dd0;
  undefined1 local_dc8 [16];
  undefined1 local_db8 [32];
  undefined1 local_d98 [16];
  undefined1 local_d88 [16];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [13];
  undefined3 uStack_d4b;
  int iStack_d48;
  bool bStack_d44;
  undefined8 local_d40;
  cpp_dec_float<200u,int,void> local_d38 [16];
  undefined1 local_d28 [16];
  undefined1 local_d18 [16];
  undefined1 local_d08 [16];
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [13];
  undefined3 uStack_ccb;
  int iStack_cc8;
  undefined1 uStack_cc4;
  undefined8 local_cc0;
  cpp_dec_float<200U,_int,_void> local_cb8;
  cpp_dec_float<200U,_int,_void> local_c38;
  undefined1 local_bb8 [128];
  undefined1 local_b38 [128];
  undefined1 local_ab8 [32];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [13];
  undefined3 uStack_a4b;
  fpclass_type fStack_a48;
  bool bStack_a44;
  undefined8 local_a40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_938 [4];
  int local_8c8;
  undefined1 local_8c4;
  fpclass_type local_8c0;
  int32_t iStack_8bc;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8b8 [4];
  int local_848;
  undefined1 local_844;
  fpclass_type local_840;
  int32_t iStack_83c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_838 [4];
  int local_7c8;
  undefined1 local_7c4;
  fpclass_type local_7c0;
  int32_t iStack_7bc;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_7b8 [4];
  int local_748;
  undefined1 local_744;
  fpclass_type local_740;
  int32_t iStack_73c;
  undefined1 local_738 [32];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [13];
  undefined3 uStack_6cb;
  fpclass_type fStack_6c8;
  bool bStack_6c4;
  undefined8 local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar24 = 0;
  pSVar3 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (2 < (int)pSVar3->m_verbosity)) {
    local_bb8._0_4_ = 3;
    local_b38._0_4_ = pSVar3->m_verbosity;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"Geometric scaling LP",0x14);
    pcVar11 = " (persistent)";
    if (!persistent) {
      pcVar11 = "";
    }
    lVar9 = 0xd;
    if (!persistent) {
      lVar9 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],pcVar11,lVar9);
    pcVar11 = " with post-equilibration";
    bVar23 = this->postequilibration == false;
    if (bVar23) {
      pcVar11 = "";
    }
    lVar9 = 0x18;
    if (bVar23) {
      lVar9 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],pcVar11,lVar9);
    cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar3->_vptr_SPxOut[2])(pSVar3,local_b38);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(local_b38,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(local_bb8,this,lp);
  this_00 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_cc0._0_4_ = cpp_dec_float_finite;
  local_cc0._4_4_ = 0x1c;
  local_d38[0] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[1] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[2] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[3] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[4] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[5] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[6] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[7] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[8] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[9] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[10] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xb] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xc] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xd] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xe] = (cpp_dec_float<200u,int,void>)0x0;
  local_d38[0xf] = (cpp_dec_float<200u,int,void>)0x0;
  local_d28 = (undefined1  [16])0x0;
  local_d18 = (undefined1  [16])0x0;
  local_d08 = (undefined1  [16])0x0;
  local_cf8 = (undefined1  [16])0x0;
  local_ce8 = (undefined1  [16])0x0;
  local_cd8 = SUB1613((undefined1  [16])0x0,0);
  uStack_ccb = 0;
  iStack_cc8 = 0;
  uStack_cc4 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_d38,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_fb4 = 0;
  if ((local_b38._120_4_ != cpp_dec_float_NaN) && (local_bb8._120_4_ != cpp_dec_float_NaN)) {
    local_fb4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_b38,
                           (cpp_dec_float<200U,_int,_void> *)local_bb8);
    local_fb4 = local_fb4 >> 0x1f;
  }
  local_6c0._0_4_ = cpp_dec_float_finite;
  local_6c0._4_4_ = 0x1c;
  local_738._0_16_ = (undefined1  [16])0x0;
  local_738._16_16_ = (undefined1  [16])0x0;
  local_718 = (undefined1  [16])0x0;
  local_708 = (undefined1  [16])0x0;
  local_6f8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_6d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_6cb = 0;
  fStack_6c8 = 0;
  bStack_6c4 = false;
  local_a40._0_4_ = cpp_dec_float_finite;
  local_a40._4_4_ = 0x1c;
  local_ab8._0_16_ = (undefined1  [16])0x0;
  local_ab8._16_16_ = (undefined1  [16])0x0;
  local_a98 = (undefined1  [16])0x0;
  local_a88 = (undefined1  [16])0x0;
  local_a78 = (undefined1  [16])0x0;
  local_a68 = (undefined1  [16])0x0;
  local_a58 = SUB1613((undefined1  [16])0x0,0);
  bVar23 = (char)local_fb4 != '\0';
  puVar13 = (undefined4 *)local_bb8;
  if (bVar23) {
    puVar13 = (undefined4 *)local_b38;
  }
  uStack_a4b = 0;
  fStack_a48 = 0;
  bStack_a44 = false;
  puVar22 = (undefined4 *)local_b38;
  if (bVar23) {
    puVar22 = (undefined4 *)local_bb8;
  }
  puVar12 = puVar13;
  puVar19 = (undefined4 *)local_738;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar19 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar24 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar24 * -2 + 1;
  }
  fStack_6c8 = puVar13[0x1c];
  bStack_6c4 = (bool)*(undefined1 *)(puVar13 + 0x1d);
  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(local_bb8 + 0x78);
  if (bVar23) {
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(local_b38 + 0x78);
  }
  fVar1 = (pnVar10->m_backend).data._M_elems[0];
  local_6c0._0_4_ = fVar1;
  local_6c0 = CONCAT44(puVar13[0x1f],fVar1);
  puVar13 = puVar22;
  puVar12 = (undefined4 *)local_ab8;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar12 = *puVar13;
    puVar13 = puVar13 + (ulong)bVar24 * -2 + 1;
    puVar12 = puVar12 + (ulong)bVar24 * -2 + 1;
  }
  fStack_a48 = puVar22[0x1c];
  bStack_a44 = (bool)*(undefined1 *)(puVar22 + 0x1d);
  pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(local_b38 + 0x78);
  if (bVar23) {
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(local_bb8 + 0x78);
  }
  fVar1 = (pnVar10->m_backend).data._M_elems[0];
  local_a40._0_4_ = fVar1;
  local_a40 = CONCAT44(puVar22[0x1f],fVar1);
  pSVar3 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
    local_ec8._0_4_ = pSVar3->m_verbosity;
    local_e48._0_4_ = 4;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," min= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_b0,lp,1);
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," max= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_130,lp,1);
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_130);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," col-ratio= ",0xc);
    puVar15 = (uint *)local_b38;
    pnVar18 = &local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_b38._112_4_;
    local_1b0.m_backend.neg = local_b38[0x74];
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," row-ratio= ",0xc);
    puVar15 = (uint *)local_bb8;
    pnVar18 = &local_230;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = local_bb8._112_4_;
    local_230.m_backend.neg = local_bb8[0x74];
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_230);
    cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar3->_vptr_SPxOut[2])(pSVar3,local_ec8);
  }
  bVar23 = false;
  if (((fpclass_type)local_a40 != cpp_dec_float_NaN) &&
     ((this->m_goodEnoughRatio).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      ((cpp_dec_float<200U,_int,_void> *)local_ab8,
                       &(this->m_goodEnoughRatio).m_backend);
    bVar23 = 0 < iVar5;
  }
  if (!bVar23) {
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
      local_ec8._0_4_ = pSVar3->m_verbosity;
      local_e48._0_4_ = 4;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],
                 "No geometric scaling done, ratio good enough",0x2c);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,local_ec8);
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
      local_ec8._0_4_ = pSVar3->m_verbosity;
      local_e48._0_4_ = 4;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],
                 " ... but will still perform equilibrium scaling",0x2f);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,local_ec8);
    }
  }
  uVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_e50._0_4_ = cpp_dec_float_finite;
  local_e50._4_4_ = 0x1c;
  local_ec8._0_16_ = (undefined1  [16])0x0;
  local_ec8._16_16_ = (undefined1  [16])0x0;
  local_ea8 = (undefined1  [16])0x0;
  local_e98 = (undefined1  [16])0x0;
  local_e88 = (undefined1  [16])0x0;
  local_e78 = (undefined1  [16])0x0;
  local_e68 = SUB1613((undefined1  [16])0x0,0);
  uStack_e5b = 0;
  fStack_e58 = cpp_dec_float_finite;
  abStack_e54[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ec8,1.0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_fa8,(ulong)uVar2,(value_type *)local_ec8,(allocator_type *)local_e48);
  uVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_e50._0_4_ = cpp_dec_float_finite;
  local_e50._4_4_ = 0x1c;
  local_ec8._0_16_ = (undefined1  [16])0x0;
  local_ec8._16_16_ = (undefined1  [16])0x0;
  local_ea8 = (undefined1  [16])0x0;
  local_e98 = (undefined1  [16])0x0;
  local_e88 = (undefined1  [16])0x0;
  local_e78 = (undefined1  [16])0x0;
  local_e68 = SUB1613((undefined1  [16])0x0,0);
  uStack_e5b = 0;
  fStack_e58 = cpp_dec_float_finite;
  abStack_e54[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ec8,1.0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_f90,(ulong)uVar2,(value_type *)local_ec8,(allocator_type *)local_e48);
  local_e50 = 0x1c00000000;
  local_ec8._0_16_ = (undefined1  [16])0x0;
  local_ec8._16_16_ = (undefined1  [16])0x0;
  local_ea8 = (undefined1  [16])0x0;
  local_e98 = (undefined1  [16])0x0;
  local_e88 = (undefined1  [16])0x0;
  local_e78 = (undefined1  [16])0x0;
  local_e68 = SUB1613((undefined1  [16])0x0,0);
  uStack_e5b = 0;
  fStack_e58 = cpp_dec_float_finite;
  abStack_e54[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_ec8,0.0);
  local_dd0 = 0x1c00000000;
  local_e48._0_16_ = (undefined1  [16])0x0;
  local_e48._16_16_ = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08 = (undefined1  [16])0x0;
  local_df8 = (undefined1  [16])0x0;
  local_de8 = SUB1613((undefined1  [16])0x0,0);
  uStack_ddb = 0;
  fStack_dd8 = cpp_dec_float_finite;
  abStack_dd4[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_e48,0.0);
  if (bVar23) {
    puVar15 = (uint *)local_738;
    pcVar17 = &local_cb8;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar17->data)._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_cb8.exp = fStack_6c8;
    local_cb8.neg = bStack_6c4;
    local_cb8.fpclass = (fpclass_type)local_6c0;
    local_cb8.prec_elem = local_6c0._4_4_;
    puVar15 = (uint *)local_ab8;
    pcVar17 = &local_c38;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar17->data)._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_c38.exp = fStack_a48;
    local_c38.neg = bStack_a44;
    local_c38.fpclass = (fpclass_type)local_a40;
    local_c38.prec_elem = local_a40._4_4_;
    if (0 < this->m_maxIterations) {
      local_f70 = (Item *)&lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_ed8 = (uint *)local_e48;
      if ((char)local_fb4 != '\0') {
        local_ed8 = (uint *)local_ec8;
      }
      local_ee0 = (uint *)local_ec8;
      if ((char)local_fb4 != '\0') {
        local_ee0 = (uint *)local_e48;
      }
      local_f78 = &(this->m_minImprovement).m_backend;
      iVar5 = 0;
      local_dc8._0_4_ = (int)(local_fb4 << 0x1f) >> 0x1f;
      local_dc8._4_4_ = (int)(local_fb4 << 0x1f) >> 0x1f;
      local_dc8._8_4_ = (int)(local_fb4 << 0x1f) >> 0x1f;
      local_dc8._12_4_ = 0;
      local_ed0 = this;
      do {
        if ((char)local_fb4 == '\0') {
          pcVar14 = local_d38;
          pvVar20 = local_8b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(undefined4 *)
             &(pvVar20->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar24 * -2 + 1) * 4;
            pvVar20 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar20 + (ulong)bVar24 * -8 + 4);
          }
          local_848 = iStack_cc8;
          local_844 = uStack_cc4;
          local_840 = (fpclass_type)local_cc0;
          iStack_83c = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)lp,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_f90,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_fa8,local_8b8,pnVar10);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar15 = (uint *)local_ec8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar15 = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
          }
          fStack_e58 = fStack_ef8;
          abStack_e54[0] = bStack_ef4;
          local_e50 = local_ef0;
          pcVar14 = local_d38;
          pvVar20 = local_938;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(undefined4 *)
             &(pvVar20->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar24 * -2 + 1) * 4;
            pvVar20 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar20 + (ulong)bVar24 * -8 + 4);
          }
          local_8c8 = iStack_cc8;
          local_8c4 = uStack_cc4;
          local_8c0 = (fpclass_type)local_cc0;
          iStack_8bc = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)local_f70,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_fa8,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_f90,local_938,pnVar10);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar15 = (uint *)local_e48;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar15 = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
          }
        }
        else {
          pcVar14 = local_d38;
          pvVar20 = local_7b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(undefined4 *)
             &(pvVar20->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar24 * -2 + 1) * 4;
            pvVar20 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar20 + (ulong)bVar24 * -8 + 4);
          }
          local_748 = iStack_cc8;
          local_744 = uStack_cc4;
          local_740 = (fpclass_type)local_cc0;
          iStack_73c = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)local_f70,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_fa8,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_f90,local_7b8,pnVar10);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar15 = (uint *)local_ec8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar15 = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
          }
          fStack_e58 = fStack_ef8;
          abStack_e54[0] = bStack_ef4;
          local_e50 = local_ef0;
          pcVar14 = local_d38;
          pvVar20 = local_838;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(undefined4 *)
             &(pvVar20->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pcVar14;
            pcVar14 = pcVar14 + ((ulong)bVar24 * -2 + 1) * 4;
            pvVar20 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)((long)pvVar20 + (ulong)bVar24 * -8 + 4);
          }
          local_7c8 = iStack_cc8;
          local_7c4 = uStack_cc4;
          local_7c0 = (fpclass_type)local_cc0;
          iStack_7bc = local_cc0._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f68,(soplex *)lp,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_f90,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_fa8,local_838,pnVar10);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          puVar15 = (uint *)local_e48;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar15 = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
          }
        }
        this = local_ed0;
        pcVar17 = local_f78;
        pSVar3 = (local_ed0->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        fStack_dd8 = fStack_ef8;
        abStack_dd4[0] = bStack_ef4;
        local_dd0 = local_ef0;
        if ((pSVar3 != (SPxOut *)0x0) && (4 < (int)pSVar3->m_verbosity)) {
          local_f68._0_4_ = pSVar3->m_verbosity;
          local_db8._0_4_ = 5;
          (*pSVar3->_vptr_SPxOut[2])(pSVar3,local_db8);
          pSVar3 = (this->
                   super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar3->m_streams[pSVar3->m_verbosity],"Geometric scaling round ",0x18);
          std::ostream::operator<<((ostream *)pSVar3->m_streams[pSVar3->m_verbosity],iVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar3->m_streams[pSVar3->m_verbosity]," col-ratio= ",0xc);
          puVar15 = local_ed8;
          pnVar18 = &local_9b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
          }
          pfVar7 = &fStack_dd8;
          if ((char)local_fb4 != '\0') {
            pfVar7 = &fStack_e58;
          }
          local_9b8.m_backend.exp = *pfVar7;
          pbVar8 = abStack_dd4;
          if ((char)local_fb4 != '\0') {
            pbVar8 = abStack_e54;
          }
          local_9b8.m_backend.neg = *pbVar8;
          local_9b8.m_backend._120_8_ = local_e50 & local_dc8._0_8_ | ~local_dc8._0_8_ & local_dd0;
          boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_9b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar3->m_streams[pSVar3->m_verbosity]," row-ratio= ",0xc);
          puVar15 = local_ee0;
          pnVar18 = &local_a38;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
          }
          pfVar7 = &fStack_e58;
          if ((char)local_fb4 != '\0') {
            pfVar7 = &fStack_dd8;
          }
          local_a38.m_backend.exp = *pfVar7;
          pbVar8 = abStack_e54;
          if ((char)local_fb4 != '\0') {
            pbVar8 = abStack_dd4;
          }
          local_a38.m_backend.neg = *pbVar8;
          local_a38.m_backend._120_8_ = local_dd0 & local_dc8._0_8_ | ~local_dc8._0_8_ & local_e50;
          boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_a38);
          cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          pSVar3 = (this->
                   super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar3->_vptr_SPxOut[2])(pSVar3,(cpp_dec_float<200U,_int,_void> *)local_f68);
        }
        local_ef0 = 0x1c00000000;
        local_f68._0_16_ = (undefined1  [16])0x0;
        local_f68._16_16_ = (undefined1  [16])0x0;
        local_f48 = (undefined1  [16])0x0;
        local_f38 = (undefined1  [16])0x0;
        local_f28 = (undefined1  [16])0x0;
        local_f18 = (undefined1  [16])0x0;
        local_f08 = SUB1613((undefined1  [16])0x0,0);
        uStack_efb = 0;
        fStack_ef8 = cpp_dec_float_finite;
        bStack_ef4 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_f68 != pcVar17) {
          pcVar16 = pcVar17;
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_f68;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar21->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar24 * -8 + 4);
          }
          fStack_ef8 = (this->m_minImprovement).m_backend.exp;
          bStack_ef4 = (this->m_minImprovement).m_backend.neg;
          local_ef0._0_4_ = (this->m_minImprovement).m_backend.fpclass;
          local_ef0._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_f68,&local_cb8);
        if ((((fpclass_type)local_e50 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_ef0 != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                               (cpp_dec_float<200U,_int,_void> *)local_f68), 0 < iVar6)) {
          local_d40._0_4_ = cpp_dec_float_finite;
          local_d40._4_4_ = 0x1c;
          local_db8._0_16_ = (undefined1  [16])0x0;
          local_db8._16_16_ = (undefined1  [16])0x0;
          local_d98 = (undefined1  [16])0x0;
          local_d88 = (undefined1  [16])0x0;
          local_d78 = (undefined1  [16])0x0;
          local_d68 = (undefined1  [16])0x0;
          local_d58 = SUB1613((undefined1  [16])0x0,0);
          uStack_d4b = 0;
          iStack_d48 = 0;
          bStack_d44 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_db8 != pcVar17) {
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_db8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
            }
            iStack_d48 = (this->m_minImprovement).m_backend.exp;
            bStack_d44 = (this->m_minImprovement).m_backend.neg;
            local_d40._0_4_ = (this->m_minImprovement).m_backend.fpclass;
            local_d40._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_db8,&local_c38);
          if ((((fpclass_type)local_dd0 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_d40 != cpp_dec_float_NaN)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_e48,
                                 (cpp_dec_float<200U,_int,_void> *)local_db8), 0 < iVar6)) break;
        }
        puVar15 = (uint *)local_ec8;
        pcVar17 = &local_cb8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar17->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar24 * -2 + 1) * 4)
          ;
        }
        local_cb8.exp = fStack_e58;
        local_cb8.neg = abStack_e54[0];
        local_cb8.fpclass = (fpclass_type)local_e50;
        local_cb8.prec_elem = local_e50._4_4_;
        puVar15 = (uint *)local_e48;
        pcVar17 = &local_c38;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar17->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar24 * -2 + 1) * 4)
          ;
        }
        local_c38.exp = fStack_dd8;
        local_c38.neg = abStack_dd4[0];
        local_c38.fpclass = (fpclass_type)local_dd0;
        local_c38.prec_elem = local_dd0._4_4_;
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->m_maxIterations);
    }
    pnVar10 = &this->m_minImprovement;
    local_ef0 = 0x1c00000000;
    local_f68._0_16_ = (undefined1  [16])0x0;
    local_f68._16_16_ = (undefined1  [16])0x0;
    local_f48 = (undefined1  [16])0x0;
    local_f38 = (undefined1  [16])0x0;
    local_f28 = (undefined1  [16])0x0;
    local_f18 = (undefined1  [16])0x0;
    local_f08 = SUB1613((undefined1  [16])0x0,0);
    uStack_efb = 0;
    fStack_ef8 = cpp_dec_float_finite;
    bStack_ef4 = false;
    if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)local_f68 != pnVar10) {
      pnVar18 = pnVar10;
      puVar15 = (uint *)local_f68;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar15 = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + (ulong)bVar24 * -8 + 4);
        puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
      }
      fStack_ef8 = (this->m_minImprovement).m_backend.exp;
      bStack_ef4 = (this->m_minImprovement).m_backend.neg;
      local_ef0._0_4_ = (this->m_minImprovement).m_backend.fpclass;
      local_ef0._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)local_f68,
               (cpp_dec_float<200U,_int,_void> *)local_738);
    if ((((fpclass_type)local_e50 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_ef0 == cpp_dec_float_NaN)) ||
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_ec8,
                           (cpp_dec_float<200U,_int,_void> *)local_f68), 0 < iVar5)) {
      local_d40._0_4_ = cpp_dec_float_finite;
      local_d40._4_4_ = 0x1c;
      local_db8._0_16_ = (undefined1  [16])0x0;
      local_db8._16_16_ = (undefined1  [16])0x0;
      local_d98 = (undefined1  [16])0x0;
      local_d88 = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = SUB1613((undefined1  [16])0x0,0);
      uStack_d4b = 0;
      iStack_d48 = 0;
      bStack_d44 = false;
      if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_db8 != pnVar10) {
        puVar15 = (uint *)local_db8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar15 = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + (ulong)bVar24 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar24 * -2 + 1;
        }
        iStack_d48 = (this->m_minImprovement).m_backend.exp;
        bStack_d44 = (this->m_minImprovement).m_backend.neg;
        local_d40._0_4_ = (this->m_minImprovement).m_backend.fpclass;
        local_d40._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)local_db8,
                 (cpp_dec_float<200U,_int,_void> *)local_ab8);
      bVar23 = false;
      if (((fpclass_type)local_dd0 != cpp_dec_float_NaN) &&
         ((fpclass_type)local_d40 != cpp_dec_float_NaN)) {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_e48,
                           (cpp_dec_float<200U,_int,_void> *)local_db8);
        bVar23 = iVar5 < 1;
      }
    }
    else {
      bVar23 = true;
    }
  }
  if ((bVar23) || (this->postequilibration != false)) {
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeColscaleExp;
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeRowscaleExp;
    if (this->postequilibration == true) {
      pcVar14 = (cpp_dec_float<200u,int,void> *)local_fa8._0_8_;
      if (!bVar23) {
        for (; this_02 = (Item *)local_f90._0_8_,
            pcVar14 != (cpp_dec_float<200u,int,void> *)local_fa8._8_8_; pcVar14 = pcVar14 + 0x80) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(pcVar14,1.0);
        }
        for (; this_02 != (Item *)local_f90._8_8_;
            this_02 = (Item *)&this_02[3].data.
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .memsize) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)this_02,1.0);
        }
      }
      pcVar14 = local_d38;
      pnVar10 = &local_2b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = *(uint *)pcVar14;
        pcVar14 = pcVar14 + ((ulong)bVar24 * -2 + 1) * 4;
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = iStack_cc8;
      local_2b0.m_backend.neg = (bool)uStack_cc4;
      local_2b0.m_backend.fpclass = (fpclass_type)local_cc0;
      local_2b0.m_backend.prec_elem = local_cc0._4_4_;
      SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computePostequiExpVecs
                (lp,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *)local_fa8,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)local_f90,vecExp_00,vecExp,&local_2b0);
    }
    else {
      SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computeExpVec(&this->
                       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)local_f90,vecExp);
      SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computeExpVec(&this->
                       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)local_fa8,vecExp_00);
    }
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[2])(this,lp);
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (4 < (int)pSVar3->m_verbosity)) {
      local_c38.data._M_elems[0] = 5;
      local_cb8.data._M_elems[0] = pSVar3->m_verbosity;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],"Row scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_330,this);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_330);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_3b0,this);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_3b0);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],"IGEOSC06 Col scaling min= ",0x1a);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_430,this);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_430);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_4b0,this);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_4b0);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_cb8);
    }
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
      local_c38.data._M_elems[0] = 4;
      local_cb8.data._M_elems[0] = pSVar3->m_verbosity;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," min= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_530,lp,0);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_530);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," max= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_5b0,lp,0);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," col-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_630,this,lp);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_630);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," row-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_6b0,this,lp);
      boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_6b0);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_cb8);
    }
  }
  else {
    pSVar3 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
      local_c38.data._M_elems[0] = 4;
      local_cb8.data._M_elems[0] = pSVar3->m_verbosity;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],"No geometric scaling done.",0x1a);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar3 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_cb8);
    }
    lp->_isScaled = true;
  }
  if ((Item *)local_f90._0_8_ != (Item *)0x0) {
    operator_delete((void *)local_f90._0_8_,(long)local_f80 - local_f90._0_8_);
  }
  if ((cpp_dec_float<200u,int,void> *)local_fa8._0_8_ != (cpp_dec_float<200u,int,void> *)0x0) {
    operator_delete((void *)local_fa8._0_8_,(long)local_f98 - local_fa8._0_8_);
  }
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}